

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::duplicate_children(Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  code *pcVar1;
  size_t l;
  size_t b;
  bool bVar2;
  error_flags eVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t in_R8;
  size_t i;
  size_t prev;
  char msg_3 [58];
  char msg_2 [31];
  char msg_1 [29];
  char msg [31];
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  Location *in_stack_fffffffffffffe20;
  size_t local_190;
  size_t local_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined1 local_158 [72];
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  char local_e8 [40];
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  char local_98 [40];
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Tree *in_stack_ffffffffffffffb8;
  Tree *in_stack_ffffffffffffffc0;
  
  if (in_RSI == 0) {
    in_stack_ffffffffffffffb8 = (Tree *)0x6166206b63656863;
    in_stack_ffffffffffffffc0 = (Tree *)0x7328203a64656c69;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    b = CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10);
    l = CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08);
    in_stack_fffffffffffffe08 = in_stack_ffffffffffffffa0;
    in_stack_fffffffffffffe0c = in_stack_ffffffffffffffa4;
    in_stack_fffffffffffffe10 = in_stack_ffffffffffffffa8;
    in_stack_fffffffffffffe14 = in_stack_ffffffffffffffac;
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,b,l,
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    in_stack_fffffffffffffe18 = in_stack_ffffffffffffffb0;
    in_stack_ffffffffffffffa0 = in_stack_fffffffffffffe08;
    in_stack_ffffffffffffffa4 = in_stack_fffffffffffffe0c;
    in_stack_ffffffffffffffa8 = in_stack_fffffffffffffe10;
    in_stack_ffffffffffffffac = in_stack_fffffffffffffe14;
    in_stack_ffffffffffffffb0 = in_stack_fffffffffffffe18;
    (*pcVar1)(&stack0xffffffffffffffb8,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_70;
    in_stack_fffffffffffffdfc = uStack_6c;
    in_stack_fffffffffffffe00 = uStack_68;
    in_stack_fffffffffffffe04 = uStack_64;
  }
  if (in_RDX == -1) {
    builtin_strncpy(local_98,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_98,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_c0;
    in_stack_fffffffffffffdfc = uStack_bc;
    in_stack_fffffffffffffe00 = uStack_b8;
    in_stack_fffffffffffffe04 = uStack_b4;
    in_stack_fffffffffffffe08 = local_b0;
    in_stack_fffffffffffffe0c = uStack_ac;
    in_stack_fffffffffffffe10 = uStack_a8;
    in_stack_fffffffffffffe14 = uStack_a4;
    in_stack_fffffffffffffe18 = local_a0;
  }
  if (in_RCX == -1) {
    builtin_strncpy(local_e8,"check failed: (parent != NONE)",0x1f);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_e8,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_110;
    in_stack_fffffffffffffdfc = uStack_10c;
    in_stack_fffffffffffffe00 = uStack_108;
    in_stack_fffffffffffffe04 = uStack_104;
    in_stack_fffffffffffffe08 = local_100;
    in_stack_fffffffffffffe0c = uStack_fc;
    in_stack_fffffffffffffe10 = uStack_f8;
    in_stack_fffffffffffffe14 = uStack_f4;
    in_stack_fffffffffffffe18 = local_f0;
  }
  if ((in_R8 != 0xffffffffffffffff) &&
     (bVar2 = has_child((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                        CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),0x2eb112),
     !bVar2)) {
    memcpy(local_158,"check failed: (after == NONE || has_child(parent, after))",0x3a);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    (*pcVar1)(local_158,0x3a,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffdf8 = local_180;
    in_stack_fffffffffffffdfc = uStack_17c;
    in_stack_fffffffffffffe00 = uStack_178;
    in_stack_fffffffffffffe04 = uStack_174;
  }
  local_190 = first_child((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  local_188 = in_R8;
  while (local_190 != 0xffffffffffffffff) {
    local_188 = duplicate(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          (size_t)in_stack_ffffffffffffffb0,
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    local_190 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  return local_188;
}

Assistant:

size_t Tree::duplicate_children(Tree const* src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, after == NONE || has_child(parent, after));

    size_t prev = after;
    for(size_t i = src->first_child(node); i != NONE; i = src->next_sibling(i))
    {
        prev = duplicate(src, i, parent, prev);
    }

    return prev;
}